

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,double,double>
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *dst,
               Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *src,
               assign_op<double,_double> *param_3)

{
  long rows;
  long cols;
  long lVar1;
  long lVar2;
  
  rows = (src->
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
         m_rows.m_value;
  cols = (src->
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
         m_cols.m_value;
  if (((dst->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>)
       .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_rows.m_value != rows) ||
     (lVar1 = cols, lVar2 = rows,
     (dst->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
     m_value != cols)) {
    DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::resize
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               dst,rows,cols);
    lVar2 = (dst->
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
            m_rows.m_value;
    lVar1 = (dst->
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
            m_cols.m_value;
  }
  if ((lVar2 == rows) && (lVar1 == cols)) {
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, SrcXprType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}